

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_DACCtrl_SetData(VGMPlayer *this)

{
  DEV_DATA *info;
  bool bVar1;
  reference pvVar2;
  PCM_BANK *this_00;
  size_type sVar3;
  reference Data;
  PCM_BANK *pcmBnk;
  DACSTRM_DEV *dacStrm;
  size_t dsID;
  VGMPlayer *this_local;
  
  if (this->_dacStrmMap[this->_fileData[(ulong)this->_filePos + 1]] != 0xffffffffffffffff) {
    pvVar2 = std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::
             operator[](&this->_dacStreams,
                        this->_dacStrmMap[this->_fileData[(ulong)this->_filePos + 1]]);
    pvVar2->bankID = this->_fileData[(ulong)this->_filePos + 2];
    if (pvVar2->bankID < 0x40) {
      this_00 = this->_pcmBank + pvVar2->bankID;
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this_00->bankOfs);
      pvVar2->maxItems = (UINT32)sVar3;
      bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this_00->data);
      if (bVar1) {
        daccontrol_set_data((pvVar2->defInf).dataPtr,(UINT8 *)0x0,0,
                            this->_fileData[(ulong)this->_filePos + 3],
                            this->_fileData[(ulong)this->_filePos + 4]);
      }
      else {
        info = (pvVar2->defInf).dataPtr;
        Data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this_00->data,0);
        sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this_00->data);
        daccontrol_set_data(info,Data,(UINT32)sVar3,this->_fileData[(ulong)this->_filePos + 3],
                            this->_fileData[(ulong)this->_filePos + 4]);
      }
    }
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_DACCtrl_SetData(void)	// DAC Stream Control: Set Data Bank
{
	size_t dsID = _dacStrmMap[fData[0x01]];
	if (dsID == (size_t)-1)
		return;
	DACSTRM_DEV* dacStrm = &_dacStreams[dsID];
	
	dacStrm->bankID = fData[0x02];
	if (dacStrm->bankID >= _PCM_BANK_COUNT)
		return;
	PCM_BANK* pcmBnk = &_pcmBank[dacStrm->bankID];
	
	dacStrm->maxItems = (UINT32)pcmBnk->bankOfs.size();
	if (pcmBnk->data.empty())
		daccontrol_set_data(dacStrm->defInf.dataPtr, NULL, 0, fData[0x03], fData[0x04]);
	else
		daccontrol_set_data(dacStrm->defInf.dataPtr, &pcmBnk->data[0], (UINT32)pcmBnk->data.size(), fData[0x03], fData[0x04]);
	return;
}